

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O2

void __thiscall
QPDFObjectHandle::typeWarning(QPDFObjectHandle *this,char *expected_type,string *warning)

{
  QPDFObject *this_00;
  QPDF *qpdf;
  char *__rhs;
  logic_error *this_01;
  allocator<char> local_1ba;
  allocator<char> local_1b9;
  QPDF *context;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_1b0;
  string description;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0;
  QPDFExc local_a0;
  
  context = (QPDF *)0x0;
  description._M_dataplus._M_p = (pointer)&description.field_2;
  description._M_string_length = 0;
  description.field_2._M_local_buf[0] = '\0';
  this_00 = (this->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  if (this_00 != (QPDFObject *)0x0) {
    QPDFObject::getDescription(this_00,&context,&description);
    qpdf = context;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"",&local_1b9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_180,"operation for ",&local_1ba);
    std::operator+(&local_160,&local_180,expected_type);
    std::operator+(&local_140,&local_160," attempted on object of type ");
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1b0,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)this);
    __rhs = getTypeName((QPDFObjectHandle *)&local_1b0);
    std::operator+(&local_120,&local_140,__rhs);
    std::operator+(&local_100,&local_120,": ");
    std::operator+(&local_e0,&local_100,warning);
    QPDFExc::QPDFExc(&local_a0,qpdf_e_object,&local_c0,&description,0,&local_e0);
    warn(qpdf,&local_a0);
    QPDFExc::~QPDFExc(&local_a0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_120);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1b0._M_refcount);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&description);
    return;
  }
  this_01 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error
            (this_01,"attempted to dereference an uninitialized QPDFObjectHandle");
  __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void
QPDFObjectHandle::typeWarning(char const* expected_type, std::string const& warning) const
{
    QPDF* context = nullptr;
    std::string description;
    // Type checks above guarantee that the object has been dereferenced. Nevertheless, dereference
    // throws exceptions in the test suite
    if (!obj) {
        throw std::logic_error("attempted to dereference an uninitialized QPDFObjectHandle");
    }
    obj->getDescription(context, description);
    // Null context handled by warn
    warn(
        context,
        QPDFExc(
            qpdf_e_object,
            "",
            description,
            0,
            std::string("operation for ") + expected_type + " attempted on object of type " +
                QPDFObjectHandle(*this).getTypeName() + ": " + warning));
}